

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterActiveVariablesCase::iterate
          (AtomicCounterActiveVariablesCase *this)

{
  _Rb_tree_header *this_00;
  RenderContext *renderCtx;
  Shader *pSVar1;
  _Base_ptr p_Var2;
  Program *programDefinition;
  TestLog *pTVar3;
  long lVar4;
  qpTestLog *__n;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  undefined4 extraout_var_00;
  long *plVar14;
  _Base_ptr p_Var15;
  TestLog *pTVar16;
  _Rb_tree_header *p_Var17;
  char *pcVar18;
  int ndx;
  int varNdx;
  long lVar19;
  long lVar20;
  _Rb_tree_header *p_Var21;
  long lVar22;
  GLint written;
  GLint numActiveVariables;
  int local_31c;
  GLint queryActiveResources;
  undefined4 uStack_314;
  pointer piStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  int local_2ec;
  ScopedLogSection section;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  GLenum activeVariablesProp;
  GLint queryMaxNumActiveVariables;
  undefined4 uStack_2b4;
  pointer pcStack_2b0;
  pointer local_2a8 [3];
  long local_290;
  ScopedLogSection section_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> numBufferVars;
  ios_base local_210 [8];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [8];
  ShaderProgram program;
  
  iVar8 = (*((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_290 = CONCAT44(extraout_var,iVar8);
  renderCtx = ((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&numBufferVars,(this->super_AtomicCounterCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&numBufferVars);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&numBufferVars._M_t._M_impl.field_0x0 + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  local_2ec = AtomicCounterCase::getNumAtomicCounterBuffers(&this->super_AtomicCounterCase);
  p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar19 = 0;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var21->_M_header;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var21->_M_header;
  while( true ) {
    pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                        ((this->super_AtomicCounterCase).m_program);
    lVar20 = local_290;
    pSVar1 = *(pvVar11->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pSVar1->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&(pSVar1->m_defaultBlock).variables.
                               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                               ._M_impl) >> 5) * -0x55555555 <= lVar19) break;
    pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                        ((this->super_AtomicCounterCase).m_program);
    lVar20 = lVar19 * 0x60;
    if ((*(int *)(*(long *)&((*(pvVar11->
                               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                            variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl + 0x20 + lVar20) == 0) &&
       (pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                            ((this->super_AtomicCounterCase).m_program),
       *(int *)(*(long *)&((*(pvVar11->
                             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                             )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).variables.
                          super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                          ._M_impl + 0x28 + lVar20) == 0x54)) {
      pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                          ((this->super_AtomicCounterCase).m_program);
      iVar8 = *(int *)(*(long *)&((*(pvVar11->
                                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                                 variables.
                                 super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                 ._M_impl + 4 + lVar20);
      queryActiveResources = iVar8;
      p_Var15 = &p_Var21->_M_header;
      for (p_Var2 = numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < iVar8]) {
        if (iVar8 <= (int)*(size_t *)(p_Var2 + 1)) {
          p_Var15 = p_Var2;
        }
      }
      p_Var17 = p_Var21;
      if (((_Rb_tree_header *)p_Var15 != p_Var21) &&
         (p_Var17 = (_Rb_tree_header *)p_Var15,
         iVar8 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
        p_Var17 = p_Var21;
      }
      if (p_Var17 == p_Var21) {
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&numBufferVars,&queryActiveResources);
        *pmVar12 = 1;
      }
      else {
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&numBufferVars,&queryActiveResources);
        *pmVar12 = *pmVar12 + 1;
      }
    }
    lVar19 = lVar19 + 1;
  }
  iVar8 = 0;
  p_Var13 = numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var13 != p_Var21) {
    if (iVar8 <= *(int *)&p_Var13[1].field_0x4) {
      iVar8 = *(int *)&p_Var13[1].field_0x4;
    }
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&numBufferVars._M_t);
  tcu::TestContext::setTestResult
            ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  programDefinition = (this->super_AtomicCounterCase).m_program;
  iVar9 = (*((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var_00,iVar9),
                     ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  pTVar3 = ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  numBufferVars._M_t._M_impl._0_8_ =
       &numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&numBufferVars,"Interface","");
  _queryActiveResources = (pointer)&local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&queryActiveResources,"ATOMIC_COUNTER_BUFFER interface","");
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar3,(string *)&numBufferVars,(string *)&queryActiveResources);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_queryActiveResources != &local_308) {
    operator_delete(_queryActiveResources,local_308._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)numBufferVars._M_t._M_impl._0_8_ !=
      &numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)numBufferVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  queryActiveResources = 0xffffffff;
  _queryMaxNumActiveVariables = (pointer *)CONCAT44(uStack_2b4,0xffffffff);
  (**(code **)(lVar20 + 0x990))(program.m_program.m_program,0x92c0,0x92f5);
  (**(code **)(lVar20 + 0x990))
            (program.m_program.m_program,0x92c0,0x92f7,&queryMaxNumActiveVariables);
  dVar10 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar10,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x944);
  numBufferVars._M_t._M_impl._0_8_ =
       ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)p_Var21,"GL_ACTIVE_RESOURCES = ",0x16);
  std::ostream::operator<<(p_Var21,queryActiveResources);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)p_Var21,"GL_MAX_NUM_ACTIVE_VARIABLES = ",0x1e);
  std::ostream::operator<<(p_Var21,queryMaxNumActiveVariables);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
  std::ios_base::~ios_base(local_208);
  if (queryActiveResources != local_2ec) {
    numBufferVars._M_t._M_impl._0_8_ =
         ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)p_Var21,"Error, got unexpected GL_ACTIVE_RESOURCES, expected ",0x34);
    std::ostream::operator<<(p_Var21,local_2ec);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
    std::ios_base::~ios_base(local_208);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_ACTIVE_RESOURCES");
  }
  if (queryMaxNumActiveVariables != iVar8) {
    numBufferVars._M_t._M_impl._0_8_ =
         ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)p_Var21,"Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected ",
               0x3c);
    std::ostream::operator<<(p_Var21,iVar8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
    std::ios_base::~ios_base(local_208);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
  }
  tcu::TestLog::endSection(section.m_log);
  if (0 < local_2ec) {
    local_31c = 0;
    iVar8 = local_2ec;
    do {
      p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      pTVar3 = ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      _queryActiveResources = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&queryActiveResources,"Resource","")
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&numBufferVars);
      std::ostream::operator<<((ostringstream *)&numBufferVars,local_31c);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&numBufferVars);
      std::ios_base::~ios_base(local_210);
      plVar14 = (long *)std::__cxx11::string::replace
                                  ((ulong)&queryMaxNumActiveVariables,0,(char *)0x0,0x9a0f18);
      section.m_log = (TestLog *)&local_2d8;
      pTVar16 = (TestLog *)(plVar14 + 2);
      if ((TestLog *)*plVar14 == pTVar16) {
        local_2d8._M_allocated_capacity = (size_type)pTVar16->m_log;
        local_2d8._8_8_ = plVar14[3];
      }
      else {
        local_2d8._M_allocated_capacity = (size_type)pTVar16->m_log;
        section.m_log = (TestLog *)*plVar14;
      }
      *plVar14 = (long)pTVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection
                (&section_1,pTVar3,(string *)&queryActiveResources,(string *)&section);
      p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      this_00 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)section.m_log != &local_2d8) {
        operator_delete(section.m_log,(ulong)(local_2d8._M_allocated_capacity + 1));
      }
      if (_queryMaxNumActiveVariables != local_2a8) {
        operator_delete(_queryMaxNumActiveVariables,(ulong)(local_2a8[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_queryActiveResources != &local_308) {
        operator_delete(_queryActiveResources,local_308._M_allocated_capacity + 1);
      }
      local_308._M_allocated_capacity = 0;
      _queryActiveResources = (pointer)0x0;
      piStack_310 = (pointer)0x0;
      local_2d8._M_allocated_capacity = 0;
      section.m_log = (TestLog *)0x0;
      _queryMaxNumActiveVariables = (pointer *)CONCAT44(uStack_2b4,0x9304);
      activeVariablesProp = 0x9305;
      numActiveVariables = -2;
      written = -1;
      (**(code **)(lVar20 + 0x9c8))
                (program.m_program.m_program,0x92c0,local_31c,1,&queryMaxNumActiveVariables,1,
                 &written,&numActiveVariables);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"query num active variables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x968);
      if (numActiveVariables < 1) {
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var21,"Error, got unexpected NUM_ACTIVE_VARIABLES: ",0x2c);
        std::ostream::operator<<
                  (&numBufferVars._M_t._M_impl.super__Rb_tree_header,numActiveVariables);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        std::ios_base::~ios_base(local_208);
        pcVar18 = "got unexpected NUM_ACTIVE_VARIABLES";
LAB_0053f2e3:
        tcu::TestContext::setTestResult
                  ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,pcVar18);
      }
      else {
        if (written < 1) {
          numBufferVars._M_t._M_impl._0_8_ =
               ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var21,"Error, query for NUM_ACTIVE_VARIABLES returned no values",
                     0x38);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
          std::ios_base::~ios_base(local_208);
          pcVar18 = "NUM_ACTIVE_VARIABLES query failed";
          goto LAB_0053f2e3;
        }
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var17,"GL_NUM_ACTIVE_VARIABLES = ",0x1a);
        std::ostream::operator<<(p_Var17,numActiveVariables);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
        std::ios_base::~ios_base(local_208);
        written = -1;
        numBufferVars._M_t._M_impl._0_4_ = 0xfffffffe;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&queryActiveResources,
                   (long)(numActiveVariables + 1),(value_type_conflict1 *)&numBufferVars);
        (**(code **)(lVar20 + 0x9c8))
                  (program.m_program.m_program,0x92c0,local_31c,1,&activeVariablesProp,
                   numActiveVariables,&written,_queryActiveResources);
        dVar10 = (**(code **)(lVar20 + 0x800))();
        glu::checkError(dVar10,"query active variables",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x97e);
        if (written != numActiveVariables) {
          numBufferVars._M_t._M_impl._0_8_ =
               ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var21,
                     "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = ",0x45);
          std::ostream::operator<<(p_Var21,numActiveVariables);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var21,", query returned ",0x11);
          std::ostream::operator<<(p_Var21,written);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21," values",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
          std::ios_base::~ios_base(local_208);
          pcVar18 = "got unexpected ACTIVE_VARIABLES";
          goto LAB_0053f2e3;
        }
        if (piStack_310[-1] != -2) {
          numBufferVars._M_t._M_impl._0_8_ =
               ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds",0x41);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::ios_base::~ios_base(local_208);
          pcVar18 = "ACTIVE_VARIABLES query failed";
          goto LAB_0053f2e3;
        }
        piStack_310 = piStack_310 + -1;
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var21,"Active variable indices: {",0x1a);
        if (0 < (int)((ulong)((long)piStack_310 - (long)_queryActiveResources) >> 2)) {
          lVar19 = 0;
          do {
            if (lVar19 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,", ",2);
            }
            std::ostream::operator<<(p_Var21,*(int *)(_queryActiveResources + lVar19 * 4));
            lVar19 = lVar19 + 1;
          } while (lVar19 < (int)((ulong)((long)piStack_310 - (long)_queryActiveResources) >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"}",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
        std::ios_base::~ios_base(local_208);
        if (0 < (int)((ulong)((long)piStack_310 - (long)_queryActiveResources) >> 2)) {
          lVar19 = 0;
          do {
            activeVariablesProp = 0x92f9;
            numActiveVariables = -1;
            written = -1;
            _queryMaxNumActiveVariables = (pointer *)0x0;
            pcStack_2b0 = (pointer)0x0;
            local_2a8[0] = (pointer)0x0;
            (**(code **)(lVar20 + 0x9c8))
                      (program.m_program.m_program,0x92e1,
                       *(undefined4 *)(_queryActiveResources + lVar19 * 4),1,&activeVariablesProp,1,
                       &written,&numActiveVariables);
            dVar10 = (**(code **)(lVar20 + 0x800))();
            glu::checkError(dVar10,"query buffer variable name length",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                            ,0x9a8);
            if (numActiveVariables == -1 || written < 1) {
              numBufferVars._M_t._M_impl._0_8_ =
                   ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var21,"Error, query for GL_NAME_LENGTH returned no values",
                         0x32);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&numBufferVars,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream
                        ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
              std::ios_base::~ios_base(local_208);
              pcVar18 = "GL_NAME_LENGTH query failed";
LAB_0053ebfd:
              tcu::TestContext::setTestResult
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar18);
            }
            else {
              numBufferVars._M_t._M_impl._0_1_ = 0x58;
              std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)&queryMaxNumActiveVariables,
                         (long)(numActiveVariables + 2),(value_type *)&numBufferVars);
              written = -1;
              (**(code **)(lVar20 + 0x9c0))
                        (program.m_program.m_program,0x92e1,
                         *(undefined4 *)(_queryActiveResources + lVar19 * 4),
                         (int)pcStack_2b0 - (int)_queryMaxNumActiveVariables,&written);
              dVar10 = (**(code **)(lVar20 + 0x800))();
              glu::checkError(dVar10,"query buffer variable name",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                              ,0x9b5);
              if ((long)written < 1) {
                numBufferVars._M_t._M_impl._0_8_ =
                     ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log;
                p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var21,"Error, query for resource name returned no name",0x2f
                          );
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&numBufferVars,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream
                          ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
                std::ios_base::~ios_base(local_208);
                pcVar18 = "Name query failed";
                goto LAB_0053ebfd;
              }
              numBufferVars._M_t._M_impl._0_8_ =
                   &numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&numBufferVars,_queryMaxNumActiveVariables,
                         (long)_queryMaxNumActiveVariables + (long)written);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &section,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&numBufferVars);
              if ((_Base_ptr *)numBufferVars._M_t._M_impl._0_8_ !=
                  &numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)numBufferVars._M_t._M_impl._0_8_,
                                (ulong)((long)&(numBufferVars._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_parent)->_M_color + 1));
              }
            }
            if (_queryMaxNumActiveVariables != (pointer *)0x0) {
              operator_delete(_queryMaxNumActiveVariables,
                              (long)local_2a8[0] - (long)_queryMaxNumActiveVariables);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (int)((ulong)((long)piStack_310 - (long)_queryActiveResources) >> 2));
        }
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var21,"Active variables:\n",0x12);
        if (0 < (int)((ulong)-(long)section.m_log >> 5)) {
          lVar19 = 8;
          lVar22 = 0;
          do {
            p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"\t",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var21,*(char **)((long)&section.m_log[-1].m_log + lVar19),
                       *(long *)((long)&(section.m_log)->m_log + lVar19));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"\n",1);
            lVar22 = lVar22 + 1;
            lVar19 = lVar19 + 0x20;
          } while (lVar22 < (int)((ulong)-(long)section.m_log >> 5));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        std::ios_base::~ios_base(local_208);
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"Verifying names",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        std::ios_base::~ios_base(local_208);
        if (0 < (int)((ulong)-(long)section.m_log >> 5)) {
          bVar6 = true;
          bVar5 = true;
          lVar19 = 0;
          do {
            iVar8 = -1;
            lVar22 = 0;
            for (lVar20 = 0;
                pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_AtomicCounterCase).m_program),
                pSVar1 = *(pvVar11->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                lVar20 < (int)((ulong)((long)(pSVar1->m_defaultBlock).variables.
                                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      *(long *)&(pSVar1->m_defaultBlock).variables.
                                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                ._M_impl) >> 5) * -0x55555555; lVar20 = lVar20 + 1)
            {
              pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_AtomicCounterCase).m_program);
              lVar4 = *(long *)&((*(pvVar11->
                                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                                variables.
                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                ._M_impl;
              __n = *(qpTestLog **)(lVar4 + 0x48 + lVar22);
              bVar7 = bVar6;
              if ((__n == section.m_log[lVar19 * 4 + 1].m_log) &&
                 ((__n == (qpTestLog *)0x0 ||
                  (iVar9 = bcmp(*(void **)(lVar4 + 0x40 + lVar22),section.m_log[lVar19 * 4].m_log,
                                (size_t)__n), iVar9 == 0)))) {
                pvVar11 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_AtomicCounterCase).m_program);
                iVar9 = *(int *)(*(long *)&((*(pvVar11->
                                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                           m_defaultBlock).variables.
                                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                           ._M_impl + 4 + lVar22);
                bVar5 = false;
                if (iVar8 == iVar9) {
                  bVar5 = bVar6;
                }
                bVar7 = bVar5;
                if (iVar8 == -1) {
                  iVar8 = iVar9;
                  bVar5 = bVar6;
                  bVar7 = bVar6;
                }
              }
              bVar6 = bVar7;
              lVar22 = lVar22 + 0x60;
            }
            if (iVar8 == -1) {
              numBufferVars._M_t._M_impl._0_8_ =
                   ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var21,"Error, could not find variable with name \"",0x2a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var21,(char *)section.m_log[lVar19 * 4].m_log,
                         (long)section.m_log[lVar19 * 4 + 1].m_log);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,"\"",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&numBufferVars,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
              std::ios_base::~ios_base(local_208);
              pcVar18 = "Variable name invalid";
LAB_0053f00d:
              tcu::TestContext::setTestResult
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar18);
            }
            else {
              iVar9 = AtomicCounterCase::getBufferVariableCount
                                (&this->super_AtomicCounterCase,iVar8);
              if (iVar9 != (int)((ulong)-(long)section.m_log >> 5)) {
                numBufferVars._M_t._M_impl._0_8_ =
                     ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log;
                p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var21,"Error, unexpected variable count for binding ",0x2d);
                std::ostream::operator<<(p_Var21,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var21,". Expected ",0xb);
                iVar8 = AtomicCounterCase::getBufferVariableCount
                                  (&this->super_AtomicCounterCase,iVar8);
                std::ostream::operator<<(p_Var21,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var21,", got ",6);
                std::ostream::operator<<(p_Var21,(int)((ulong)-(long)section.m_log >> 5));
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&numBufferVars,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var21);
                std::ios_base::~ios_base(local_208);
                pcVar18 = "Variable names invalid";
                goto LAB_0053f00d;
              }
            }
            lVar20 = local_290;
            iVar8 = local_2ec;
            lVar19 = lVar19 + 1;
          } while (lVar19 < (int)((ulong)-(long)section.m_log >> 5));
          if (!bVar5) {
            numBufferVars._M_t._M_impl._0_8_ =
                 ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            p_Var21 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var21,"Error, all resource do not share the same buffer",0x30);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage
                      );
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
            std::ios_base::~ios_base(local_208);
            tcu::TestContext::setTestResult
                      ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx,QP_TEST_RESULT_FAIL,"Active variables invalid");
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&section);
      if (_queryActiveResources != (pointer)0x0) {
        operator_delete(_queryActiveResources,
                        local_308._M_allocated_capacity - (long)_queryActiveResources);
      }
      tcu::TestLog::endSection(section_1.m_log);
      local_31c = local_31c + 1;
    } while (local_31c != iVar8);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

AtomicCounterActiveVariablesCase::IterateResult AtomicCounterActiveVariablesCase::iterate (void)
{
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const int					numAtomicBuffers				= getNumAtomicCounterBuffers();
	const int					expectedMaxNumActiveVariables	= getMaxNumActiveVariables();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// check active variables
	{
		const tcu::ScopedLogSection	section						(m_testCtx.getLog(), "Interface", "ATOMIC_COUNTER_BUFFER interface");
		glw::GLint					queryActiveResources		= -1;
		glw::GLint					queryMaxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, &queryActiveResources);
		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, &queryMaxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_ACTIVE_RESOURCES = " << queryActiveResources << "\n"
			<< "GL_MAX_NUM_ACTIVE_VARIABLES = " << queryMaxNumActiveVariables << "\n"
			<< tcu::TestLog::EndMessage;

		if (queryActiveResources != numAtomicBuffers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_ACTIVE_RESOURCES, expected " << numAtomicBuffers << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_ACTIVE_RESOURCES");
		}

		if (queryMaxNumActiveVariables != expectedMaxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected " << expectedMaxNumActiveVariables << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
		}
	}

	// Check each buffer
	for (int bufferNdx = 0; bufferNdx < numAtomicBuffers; ++bufferNdx)
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Resource", "Resource index " + de::toString(bufferNdx));
		std::vector<glw::GLint>		activeVariables;
		std::vector<std::string>	memberNames;

		// Find active variables
		{
			const glw::GLenum	numActiveVariablesProp	= GL_NUM_ACTIVE_VARIABLES;
			const glw::GLenum	activeVariablesProp		= GL_ACTIVE_VARIABLES;
			glw::GLint			numActiveVariables		= -2;
			glw::GLint			written					= -1;

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &numActiveVariablesProp, 1, &written, &numActiveVariables);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query num active variables");

			if (numActiveVariables <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected NUM_ACTIVE_VARIABLES: " << numActiveVariables  << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected NUM_ACTIVE_VARIABLES");
				continue;
			}

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for NUM_ACTIVE_VARIABLES returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_NUM_ACTIVE_VARIABLES = " << numActiveVariables << tcu::TestLog::EndMessage;

			written = -1;
			activeVariables.resize(numActiveVariables + 1, -2);

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &activeVariablesProp, numActiveVariables, &written, &activeVariables[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query active variables");

			if (written != numActiveVariables)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = " << numActiveVariables << ", query returned " << written << " values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected ACTIVE_VARIABLES");
				continue;
			}

			if (activeVariables.back() != -2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "ACTIVE_VARIABLES query failed");
				continue;
			}

			activeVariables.pop_back();
		}

		// log indices
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variable indices: {";
			for (int varNdx = 0; varNdx < (int)activeVariables.size(); ++varNdx)
			{
				if (varNdx)
					builder << ", ";
				builder << activeVariables[varNdx];
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		// collect member names
		for (int ndx = 0; ndx < (int)activeVariables.size(); ++ndx)
		{
			const glw::GLenum	nameLengthProp	= GL_NAME_LENGTH;
			glw::GLint			nameLength		= -1;
			glw::GLint			written			= -1;
			std::vector<char>	nameBuf;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, activeVariables[ndx], 1, &nameLengthProp, 1, &written, &nameLength);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name length");

			if (written <= 0 || nameLength == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for GL_NAME_LENGTH returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
				continue;
			}

			nameBuf.resize(nameLength + 2, 'X'); // +2 to tolerate potential off-by-ones in some implementations, name queries will check these cases better
			written = -1;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, activeVariables[ndx], (int)nameBuf.size(), &written, &nameBuf[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name");

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource name returned no name" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Name query failed");
				continue;
			}

			memberNames.push_back(std::string(&nameBuf[0], written));
		}

		// log names
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variables:\n";
			for (int varNdx = 0; varNdx < (int)memberNames.size(); ++varNdx)
			{
				builder << "\t" << memberNames[varNdx] << "\n";
			}
			builder << tcu::TestLog::EndMessage;
		}

		// check names are all in the same buffer
		{
			bool bindingsValid = true;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying names" << tcu::TestLog::EndMessage;

			for (int nameNdx = 0; nameNdx < (int)memberNames.size(); ++nameNdx)
			{
				int prevBinding = -1;

				for (int varNdx = 0; varNdx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++varNdx)
				{
					if (m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].name == memberNames[nameNdx])
					{
						const int varBinding = m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].layout.binding;

						if (prevBinding == -1 || prevBinding == varBinding)
							prevBinding = varBinding;
						else
							bindingsValid = false;
					}
				}

				if (prevBinding == -1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, could not find variable with name \"" << memberNames[nameNdx] << "\"" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable name invalid");
				}
				else if (getBufferVariableCount(prevBinding) != (int)memberNames.size())
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Error, unexpected variable count for binding " << prevBinding
						<< ". Expected " << getBufferVariableCount(prevBinding) << ", got " << (int)memberNames.size()
						<< tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable names invalid");
				}
			}

			if (!bindingsValid)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, all resource do not share the same buffer" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Active variables invalid");
				continue;
			}
		}
	}

	return STOP;
}